

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToOneInstance *this,
          ConstPixelBufferAccess *alphaOneImage,ConstPixelBufferAccess *noAlphaOneImage)

{
  TextureFormat TVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  int i;
  long lVar6;
  ostream *stream;
  ulong uVar7;
  int iVar8;
  int iVar9;
  Vector<bool,_4> res;
  ostringstream message;
  ConstPixelBufferAccess local_1f0;
  undefined1 local_1c8 [24];
  string *local_1b0;
  ConstPixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  iVar9 = (this->m_renderSize).m_data[1];
  bVar3 = 0 < iVar9;
  if (0 < iVar9) {
    local_1b0 = (string *)&__return_storage_ptr__->m_description;
    local_1c8._16_8_ = &(__return_storage_ptr__->m_description).field_2;
    iVar9 = 0;
    local_1f0.m_data = noAlphaOneImage;
    do {
      iVar8 = (this->m_renderSize).m_data[0];
      bVar4 = 0 < iVar8;
      if (0 < iVar8) {
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel(local_1a8,(int)alphaOneImage,iVar8,iVar9);
          tcu::ConstPixelBufferAccess::getPixel(&local_1f0,(int)noAlphaOneImage,iVar8,iVar9);
          local_1c8._0_4_ = R;
          lVar6 = 0;
          do {
            local_1c8[lVar6] =
                 (float)local_1f0.m_size.m_data[lVar6 + -2] <=
                 (float)local_1a8[0].m_size.m_data[lVar6 + -2];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          if (local_1c8[0] == R) {
LAB_004bc2e1:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsatisfied condition: ",0x17);
            tcu::ConstPixelBufferAccess::getPixel(&local_1f0,(int)alphaOneImage,iVar8,iVar9);
            stream = tcu::operator<<((ostream *)local_1a8,(Vector<float,_4> *)&local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>(stream," >= ",4);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_1c8,(int)local_1f0.m_data,iVar8,iVar9);
            tcu::operator<<(stream,(Vector<float,_4> *)local_1c8);
            std::__cxx11::stringbuf::str();
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_1c8._16_8_;
            std::__cxx11::string::_M_construct<char*>
                      (local_1b0,local_1f0.m_format,
                       (undefined1 *)(local_1f0.m_size.m_data._0_8_ + (long)local_1f0.m_format));
            noAlphaOneImage = (ConstPixelBufferAccess *)local_1f0.m_data;
            if (local_1f0.m_format != (TextureFormat)(local_1f0.m_size.m_data + 2)) {
              operator_delete((void *)local_1f0.m_format,local_1f0._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            if (bVar4) {
              if (bVar3) {
                return __return_storage_ptr__;
              }
              goto LAB_004bc3f6;
            }
            break;
          }
          uVar5 = 0;
          do {
            uVar7 = uVar5;
            if (uVar7 == 3) break;
            uVar5 = uVar7 + 1;
          } while (local_1c8[uVar7 + 1] != '\0');
          if (uVar7 < 3) goto LAB_004bc2e1;
          iVar8 = iVar8 + 1;
          iVar2 = (this->m_renderSize).m_data[0];
          bVar4 = iVar8 < iVar2;
        } while (iVar8 < iVar2);
      }
      iVar9 = iVar9 + 1;
      iVar8 = (this->m_renderSize).m_data[1];
      bVar3 = iVar9 < iVar8;
    } while (iVar9 < iVar8);
  }
LAB_004bc3f6:
  TVar1 = (TextureFormat)(local_1a8[0].m_size.m_data + 2);
  local_1a8[0].m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one"
             ,"");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1a8[0].m_format,
             (undefined1 *)(local_1a8[0].m_size.m_data._0_8_ + (long)local_1a8[0].m_format));
  if (local_1a8[0].m_format != TVar1) {
    operator_delete((void *)local_1a8[0].m_format,local_1a8[0]._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus AlphaToOneInstance::verifyImage (const tcu::ConstPixelBufferAccess&	alphaOneImage,
												 const tcu::ConstPixelBufferAccess&	noAlphaOneImage)
{
	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (!tcu::boolAll(tcu::greaterThanEqual(alphaOneImage.getPixel(x, y), noAlphaOneImage.getPixel(x, y))))
			{
				std::ostringstream message;
				message << "Unsatisfied condition: " << alphaOneImage.getPixel(x, y) << " >= " << noAlphaOneImage.getPixel(x, y);
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one");
}